

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

BOOL __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::ReassignPages
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,Recycler *recycler)

{
  code *pcVar1;
  PageSegment *this_00;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  IdleDecommitPageAllocator *pIVar6;
  char *baseAddress;
  char *address;
  uint pagecount;
  IdleDecommitPageAllocator *pageAllocator;
  PageSegment *segment;
  Recycler *recycler_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  segment = (PageSegment *)recycler;
  recycler_local = (Recycler *)this;
  if ((this->super_HeapBlock).address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x13b,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((this->super_HeapBlock).segment != (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x13c,"(this->segment == nullptr)","this->segment == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar6 = GetPageAllocator(this);
  uVar3 = GetPageCount(this);
  baseAddress = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::AllocPagesPageAligned
                          (&pIVar6->super_PageAllocator,uVar3,
                           (PageSegmentBase<Memory::VirtualAllocWrapper> **)&pageAllocator);
  if (baseAddress == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar3 = GetPageCount(this);
    segment[0x296].super_SegmentBase<Memory::VirtualAllocWrapper>.address =
         segment[0x296].super_SegmentBase<Memory::VirtualAllocWrapper>.address + uVar3;
    bVar2 = HeapBlock::IsLeafBlock(&this->super_HeapBlock);
    this_00 = segment;
    if (!bVar2) {
      uVar3 = GetPageCount(this);
      Recycler::VerifyZeroFill((Recycler *)this_00,baseAddress,(ulong)(uVar3 << 0xc));
    }
    BVar4 = SetPage(this,baseAddress,(PageSegment *)pageAllocator,(Recycler *)segment);
    if (BVar4 == 0) {
      pIVar6 = GetPageAllocator(this);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&pIVar6->super_PageAllocator);
      ReleasePages(this,(Recycler *)segment);
      pIVar6 = GetPageAllocator(this);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar6->super_PageAllocator);
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::ReassignPages(Recycler * recycler)
{
    Assert(this->address == nullptr);
    Assert(this->segment == nullptr);

    PageSegment * segment;

    auto pageAllocator = this->GetPageAllocator();
    uint pagecount = this->GetPageCount();
    char * address = pageAllocator->AllocPagesPageAligned(pagecount, &segment);

    if (address == NULL)
    {
        return FALSE;
    }

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += this->GetPageCount();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
    if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_THREAD_PAGE
        && !this->IsWithBarrier()
#endif
        )
    {
        recycler->VerifyZeroFill(address, AutoSystemInfo::PageSize * this->GetPageCount());
    }
#endif

    if (!this->SetPage(address, segment, recycler))
    {
        this->GetPageAllocator()->SuspendIdleDecommit();
        this->ReleasePages(recycler);
        this->GetPageAllocator()->ResumeIdleDecommit();
        return FALSE;
    }

    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, this->GetPageCount() * AutoSystemInfo::PageSize);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockFreeObjectSize, this->GetPageCount() * AutoSystemInfo::PageSize);
    return TRUE;
}